

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS OutputBoolObject(JlDataObject *BoolObject,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags
                          ,uint32_t StackDepth)

{
  JL_OUTPUT_FLAGS BufferContext;
  char *__s;
  size_t DataSize;
  char *boolStringPtr;
  JL_STATUS local_28;
  uint32_t uStack_24;
  _Bool boolValue;
  JL_STATUS jlStatus;
  uint32_t StackDepth_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  JlDataObject *BoolObject_local;
  
  boolStringPtr._7_1_ = 0;
  uStack_24 = StackDepth;
  _jlStatus = OutputFlags;
  OutputFlags_local = (JL_OUTPUT_FLAGS)JsonBuffer;
  JsonBuffer_local = (JlBuffer *)BoolObject;
  local_28 = JlGetObjectBool(BoolObject,(_Bool *)((long)&boolStringPtr + 7));
  BufferContext = OutputFlags_local;
  if (local_28 == JL_STATUS_SUCCESS) {
    __s = "false";
    if ((boolStringPtr._7_1_ & 1) != 0) {
      __s = "true";
    }
    DataSize = strlen(__s);
    local_28 = JlBufferAdd((JlBuffer *)BufferContext,__s,DataSize);
  }
  return local_28;
}

Assistant:

JL_STATUS
    OutputBoolObject
    (
        JlDataObject const*     BoolObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    bool boolValue = false;

    jlStatus = JlGetObjectBool( BoolObject, &boolValue );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        char const* boolStringPtr = boolValue ? "true" : "false";
        jlStatus = JlBufferAdd( JsonBuffer, boolStringPtr, strlen(boolStringPtr) );
    }

    return jlStatus;
}